

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

uint32_t __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsU32(AMFImporter *this)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  runtime_error *prVar3;
  uint32_t uVar4;
  char cVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 == '\0') {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"XML_ReadNode_GetVal_AsU32. No data, seems file is corrupt.","");
    std::runtime_error::runtime_error(prVar3,(string *)local_40);
    *(undefined ***)prVar3 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar1 == 3) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
    pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
    cVar5 = *pcVar2;
    uVar4 = 0;
    if (0xf5 < (byte)(cVar5 - 0x3aU)) {
      uVar4 = 0;
      do {
        pcVar2 = pcVar2 + 1;
        uVar4 = (uint)(byte)(cVar5 - 0x30) + uVar4 * 10;
        cVar5 = *pcVar2;
      } while (0xf5 < (byte)(cVar5 - 0x3aU));
    }
    return uVar4;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "XML_ReadNode_GetVal_AsU32. Invalid type of XML element, seems file is corrupt.","");
  std::runtime_error::runtime_error(prVar3,(string *)local_40);
  *(undefined ***)prVar3 = &PTR__runtime_error_007dd738;
  __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t AMFImporter::XML_ReadNode_GetVal_AsU32()
{
	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsU32. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT) throw DeadlyImportError("XML_ReadNode_GetVal_AsU32. Invalid type of XML element, seems file is corrupt.");

	return strtoul10(mReader->getNodeData());
}